

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadKEYS(B3DImporter *this,aiNodeAnim *nodeAnim)

{
  pointer *this_00;
  pointer *this_01;
  uint uVar1;
  size_type sVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  double dVar5;
  aiVector3D aVar6;
  aiQuaternion aVar7;
  float local_188;
  float fStack_184;
  aiQuaternion local_110;
  aiQuatKey local_100;
  aiVector3D local_e8;
  aiVector3D local_d8;
  aiVectorKey local_c8;
  aiVector3D local_b0;
  aiVector3D local_a0;
  aiVectorKey local_90;
  int local_78;
  int frame;
  uint local_64;
  undefined1 local_60 [4];
  int flags;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> rot;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> scale;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> trans;
  aiNodeAnim *nodeAnim_local;
  B3DImporter *this_local;
  
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector
            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             &scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector
            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             &rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::vector
            ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)local_60);
  local_64 = ReadInt(this);
  while( true ) {
    uVar1 = ChunkSize(this);
    if (uVar1 == 0) break;
    local_78 = ReadInt(this);
    if ((local_64 & 1) != 0) {
      dVar5 = (double)local_78;
      aVar6 = ReadVec3(this);
      local_b0 = aVar6;
      local_a0 = aVar6;
      aiVectorKey::aiVectorKey(&local_90,dVar5,&local_a0);
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                 &scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_90);
    }
    if ((local_64 & 2) != 0) {
      dVar5 = (double)local_78;
      aVar6 = ReadVec3(this);
      local_e8 = aVar6;
      local_d8 = aVar6;
      aiVectorKey::aiVectorKey(&local_c8,dVar5,&local_d8);
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                 &rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c8);
    }
    if ((local_64 & 4) != 0) {
      dVar5 = (double)local_78;
      aVar7 = ReadQuat(this);
      local_110._0_8_ = aVar7._0_8_;
      local_188 = aVar7.y;
      fStack_184 = aVar7.z;
      local_110.y = local_188;
      local_110.z = fStack_184;
      aiQuatKey::aiQuatKey(&local_100,dVar5,&local_110);
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back
                ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)local_60,&local_100);
    }
  }
  if ((local_64 & 1) != 0) {
    this_00 = &scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar2 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_00);
    nodeAnim->mNumPositionKeys = (uint)sVar2;
    paVar3 = to_array<aiVectorKey>
                       (this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_00);
    nodeAnim->mPositionKeys = paVar3;
  }
  if ((local_64 & 2) != 0) {
    this_01 = &rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar2 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_01);
    nodeAnim->mNumScalingKeys = (uint)sVar2;
    paVar3 = to_array<aiVectorKey>
                       (this,(vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_01);
    nodeAnim->mScalingKeys = paVar3;
  }
  if ((local_64 & 4) != 0) {
    sVar2 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size
                      ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)local_60);
    nodeAnim->mNumRotationKeys = (uint)sVar2;
    paVar4 = to_array<aiQuatKey>(this,(vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)local_60);
    nodeAnim->mRotationKeys = paVar4;
  }
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::~vector
            ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)local_60);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector
            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             &rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector
            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
             &scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void B3DImporter::ReadKEYS( aiNodeAnim *nodeAnim ){
    vector<aiVectorKey> trans,scale;
    vector<aiQuatKey> rot;
    int flags=ReadInt();
    while( ChunkSize() ){
        int frame=ReadInt();
        if( flags & 1 ){
            trans.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 2 ){
            scale.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 4 ){
            rot.push_back( aiQuatKey( frame,ReadQuat() ) );
        }
    }

    if( flags & 1 ){
        nodeAnim->mNumPositionKeys=static_cast<unsigned int>(trans.size());
        nodeAnim->mPositionKeys=to_array( trans );
    }

    if( flags & 2 ){
        nodeAnim->mNumScalingKeys=static_cast<unsigned int>(scale.size());
        nodeAnim->mScalingKeys=to_array( scale );
    }

    if( flags & 4 ){
        nodeAnim->mNumRotationKeys=static_cast<unsigned int>(rot.size());
        nodeAnim->mRotationKeys=to_array( rot );
    }
}